

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_any(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  ly_stmt lVar1;
  lysp_node *plVar2;
  uint16_t uVar3;
  LY_ERR LVar4;
  lysp_node *plVar5;
  char *pcVar6;
  char *local_c8;
  ly_ctx *local_b0;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  long *plStack_58;
  LY_ERR ret___1;
  char **iter__;
  size_t offset__;
  char *p__;
  LY_ERR ret__;
  lysp_node_anydata *any;
  lysp_node **siblings_local;
  lysp_node *parent_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    plVar5 = (lysp_node *)calloc(1,0x50);
    if (plVar5 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_any");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      if (*siblings == (lysp_node *)0x0) {
        *siblings = plVar5;
      }
      else {
        plVar2 = *siblings;
        while (plStack_58 = (long *)((long)plVar2 + (long)*siblings + (0x10 - (long)*siblings)),
              *plStack_58 != 0) {
          plVar2 = (lysp_node *)*plStack_58;
        }
        *plStack_58 = (long)plVar5;
      }
      uVar3 = 0x20;
      if (stmt->kw == LY_STMT_ANYDATA) {
        uVar3 = 0x60;
      }
      plVar5->nodetype = uVar3;
      plVar5->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        local_a0 = (ly_ctx *)0x0;
      }
      else {
        local_a0 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert(local_a0,stmt->arg,0,&plVar5->name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_CONFIG) {
            LVar4 = lysp_stmt_config(ctx,_ret___3,&plVar5->flags,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_DESCRIPTION) {
            LVar4 = lysp_stmt_text_field(ctx,_ret___3,0,&plVar5->dsc,Y_STR_ARG,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
            LVar4 = lysp_stmt_ext(ctx,_ret___3,stmt->kw,0,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_IF_FEATURE) {
            LVar4 = lysp_stmt_qnames(ctx,_ret___3,&plVar5->iffeatures,Y_STR_ARG,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_MANDATORY) {
            LVar4 = lysp_stmt_mandatory(ctx,_ret___3,&plVar5->flags,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_MUST) {
            LVar4 = lysp_stmt_restrs(ctx,_ret___3,(lysp_restr **)(plVar5 + 1));
          }
          else if (lVar1 == LY_STMT_REFERENCE) {
            LVar4 = lysp_stmt_text_field(ctx,_ret___3,0,&plVar5->ref,Y_STR_ARG,&plVar5->exts);
          }
          else if (lVar1 == LY_STMT_STATUS) {
            LVar4 = lysp_stmt_status(ctx,_ret___3,&plVar5->flags,&plVar5->exts);
          }
          else {
            if (lVar1 != LY_STMT_WHEN) {
              if (ctx == (lysp_ctx *)0x0) {
                local_b0 = (ly_ctx *)0x0;
              }
              else {
                local_b0 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar6 = lyplg_ext_stmt2str(_ret___3->kw);
              if ((plVar5->nodetype & 0x60) == 0x60) {
                local_c8 = lyplg_ext_stmt2str(LY_STMT_ANYDATA);
              }
              else {
                local_c8 = lyplg_ext_stmt2str(LY_STMT_ANYXML);
              }
              ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar6,local_c8);
              return LY_EVALID;
            }
            LVar4 = lysp_stmt_when(ctx,_ret___3,(lysp_when **)&plVar5[1].nodetype);
          }
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_any(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent, struct lysp_node **siblings)
{
    struct lysp_node_anydata *any;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new structure and insert into siblings */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, any, next, LY_EMEM);

    any->nodetype = stmt->kw == LY_STMT_ANYDATA ? LYS_ANYDATA : LYS_ANYXML;
    any->parent = parent;

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &any->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->dsc, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &any->iffeatures, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &any->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &any->ref, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &any->flags, &any->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &any->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &any->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw),
                    (any->nodetype & LYS_ANYDATA) == LYS_ANYDATA ? lyplg_ext_stmt2str(LY_STMT_ANYDATA) : lyplg_ext_stmt2str(LY_STMT_ANYXML));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}